

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

Abc_Time_t * Abc_NtkGetCoRequiredTimes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Time_t *pAVar2;
  Abc_Obj_t *pNode_00;
  Abc_Time_t *pAVar3;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Time_t *p;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCoNum(pNtk);
  pAVar2 = (Abc_Time_t *)calloc((long)iVar1,8);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pNode_00 = Abc_NtkCo(pNtk,local_2c);
      pAVar3 = Abc_NodeRequired(pNode_00);
      pAVar2[local_2c] = *pAVar3;
    }
  }
  return pAVar2;
}

Assistant:

Abc_Time_t * Abc_NtkGetCoRequiredTimes( Abc_Ntk_t * pNtk )
{
    Abc_Time_t * p;
    Abc_Obj_t * pNode;
    int i;
    p = ABC_CALLOC( Abc_Time_t, Abc_NtkCoNum(pNtk) );
    if ( pNtk->pManTime == NULL )
        return p;
    // set the PO required times
    Abc_NtkForEachCo( pNtk, pNode, i )
        p[i] = *Abc_NodeRequired(pNode);
    return p;
}